

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O1

int mcpl2phits(char *inmcplfile,char *outphitsdumpfile,int use_polarisation,
              uint64_t nparticles_limit,int reclen)

{
  bool bVar1;
  int32_t iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  uint64_t uVar9;
  size_t lbuf;
  mcpl_generic_wfilehandle_t fout;
  mcpl_generic_wfilehandle_t local_b0;
  double local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  double dStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((reclen != 4) && (reclen != 8)) {
    phits_error(
               "Reclen parameter should be 4 (32bit Fortran record markers, recommended) or 8 (64bit Fortran record markers)"
               );
  }
  uVar3 = mcpl_open_file(inmcplfile);
  uVar4 = mcpl_hdr_srcname(uVar3);
  uVar5 = mcpl_hdr_nparticles(uVar3);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",uVar4,uVar5);
  puts("Creating (or overwriting) output PHITS file.");
  mcpl_generic_wfopen(&local_b0,outphitsdumpfile);
  if (local_b0.internal == (void *)0x0) {
    phits_error("Problems opening new PHITS file");
  }
  puts("Initiating particle conversion loop.");
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  dStack_50 = 0.0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0.0;
  uStack_90 = 0;
  local_38 = 0;
  lbuf = 0x68;
  if (use_polarisation == 0) {
    lbuf = 0x50;
  }
  uVar8 = 0;
  uVar9 = 0;
  do {
    puVar6 = (undefined8 *)mcpl_read(uVar3);
    bVar1 = true;
    if (puVar6 != (undefined8 *)0x0) {
      iVar2 = conv_code_pdg2phits(*(int32_t *)(puVar6 + 0xc));
      if (iVar2 == 0) {
        uVar8 = uVar8 + 1;
        if (uVar8 < 0x65) {
          bVar1 = false;
          printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n"
                 ,(long)*(int *)(puVar6 + 0xc));
          if (uVar8 != 100) goto LAB_00103441;
          puts("WARNING: Suppressing future warnings regarding non-convertible PDG codes.");
        }
      }
      else {
        local_98 = (double)iVar2;
        uStack_90 = puVar6[4];
        local_88 = puVar6[5];
        uStack_80 = puVar6[6];
        local_78 = puVar6[7];
        uStack_70 = puVar6[8];
        local_68 = puVar6[9];
        uStack_60 = *puVar6;
        local_58 = puVar6[0xb];
        dStack_50 = (double)puVar6[10] * 1000000.0;
        local_48 = puVar6[1];
        uStack_40 = puVar6[2];
        local_38 = puVar6[3];
        if (uVar9 == 0x7fffffff) {
          puts(
              "WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump file - it is not known whether PHITS will be able to deal with such files correctly."
              );
        }
        phits_writerecord(&local_b0,reclen,lbuf,(char *)&local_98);
        uVar9 = uVar9 + 1;
        if (uVar9 == nparticles_limit) {
          lVar7 = mcpl_hdr_nparticles(uVar3);
          lVar7 = lVar7 - (uVar9 + uVar8);
          if (lVar7 != 0) {
            printf("Output limit of %llu particles reached. Ignoring remaining %llu particles in the MCPL file.\n"
                   ,nparticles_limit,lVar7);
          }
          goto LAB_00103441;
        }
      }
      bVar1 = false;
    }
LAB_00103441:
    if (bVar1) {
      puts("Ending particle conversion loop.");
      if (uVar8 != 0) {
        printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to PHITS codes.\n"
               ,uVar8);
      }
      mcpl_close_file(uVar3);
      mcpl_generic_fwclose(&local_b0);
      printf("Created %s with %lli particles.\n",outphitsdumpfile,uVar9);
      return 1;
    }
  } while( true );
}

Assistant:

int mcpl2phits( const char * inmcplfile, const char * outphitsdumpfile,
                int use_polarisation, uint64_t nparticles_limit, int reclen )
{
  if ( reclen != 4 && reclen != 8 )
    phits_error("Reclen parameter should be 4 (32bit Fortran record markers,"
                " recommended) or 8 (64bit Fortran record markers)");

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  printf("Creating (or overwriting) output PHITS file.\n");

  //Open new phits file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen(outphitsdumpfile);

  if (!fout.internal)
    phits_error("Problems opening new PHITS file");

  uint64_t used = 0;
  uint64_t skipped_nophitstype = 0;

  printf("Initiating particle conversion loop.\n");

  double dumpdata[13] = {0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.};//explicit since gcc 4.1-4.6 might warn on ={0}; syntax

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if ( !mcpl_p )
      break;
    int32_t rawtype =  conv_code_pdg2phits( mcpl_p->pdgcode );
    if (!rawtype) {
      ++skipped_nophitstype;
      if (skipped_nophitstype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n",
               (long)mcpl_p->pdgcode);
        if (skipped_nophitstype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    assert(rawtype!=0);

    dumpdata[0] = rawtype;
    dumpdata[1] = mcpl_p->position[0];//Already in cm
    dumpdata[2] = mcpl_p->position[1];//Already in cm
    dumpdata[3] = mcpl_p->position[2];//Already in cm
    dumpdata[4] = mcpl_p->direction[0];
    dumpdata[5] = mcpl_p->direction[1];
    dumpdata[6] = mcpl_p->direction[2];
    dumpdata[7] = mcpl_p->ekin;//Already in MeV
    dumpdata[8] = mcpl_p->weight;
    dumpdata[9] = mcpl_p->time * 1.0e6;//ms->ns
    dumpdata[10] = mcpl_p->polarisation[0];
    dumpdata[11] = mcpl_p->polarisation[1];
    dumpdata[12] = mcpl_p->polarisation[2];

    if (used==INT32_MAX) {
      printf("WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump "
             "file - it is not known whether PHITS will be able to deal with such files correctly.\n");
    }
    phits_writerecord(&fout,reclen,sizeof(double)*(use_polarisation?13:10),(char*)&dumpdata[0]);

    if (++used==nparticles_limit) {
      uint64_t remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nophitstype - used;
      if (remaining)
        printf("Output limit of %llu particles reached. Ignoring"
               " remaining %llu particles in the MCPL file.\n",
               (unsigned long long)nparticles_limit,
               (unsigned long long)remaining );
      break;
    }


  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nophitstype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to PHITS codes.\n",(long long)skipped_nophitstype);
  }
  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles.\n",outphitsdumpfile,(long long)used);

  return 1;


}